

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLRParser.cpp
# Opt level: O1

bool __thiscall
GLRParser::closure(GLRParser *this,
                  set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>
                  *markedProductions,
                  set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>
                  *allMarkedProductions)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  pointer pbVar3;
  size_t __n;
  size_t sVar4;
  undefined8 uVar5;
  bool bVar6;
  int iVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var9;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var10;
  _Base_ptr p_Var11;
  string *var;
  _Rb_tree_node_base *p_Var12;
  size_t sVar13;
  undefined8 uVar14;
  ulong uVar15;
  pointer pbVar16;
  string nextChar;
  set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> initProductionsFromVar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  prodTo;
  Production *production;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  prodTo2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  prodTo1;
  set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> followingTerminalInit;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  terminalsImmRightOfMarker;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  _Base_ptr local_150;
  _Base_ptr local_148;
  pointer local_140;
  undefined1 local_138 [16];
  _Rb_tree_node_base *local_128;
  _Rb_tree_node_base *local_110;
  set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> *local_108;
  GLRParser *local_100;
  _Rb_tree<Production*,Production*,std::_Identity<Production*>,std::less<Production*>,std::allocator<Production*>>
  *local_f8;
  undefined1 local_f0 [32];
  Production *local_d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b0;
  size_t local_98;
  _Rb_tree<Production_*,_Production_*,_std::_Identity<Production_*>,_std::less<Production_*>,_std::allocator<Production_*>_>
  local_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_90._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_90._M_impl.super__Rb_tree_header._M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var11 = (markedProductions->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_98 = (markedProductions->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  p_Var12 = &(markedProductions->_M_t)._M_impl.super__Rb_tree_header._M_header;
  local_108 = allMarkedProductions;
  local_100 = this;
  local_f8 = (_Rb_tree<Production*,Production*,std::_Identity<Production*>,std::less<Production*>,std::allocator<Production*>>
              *)markedProductions;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right =
       local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  if (p_Var11 != p_Var12) {
    local_148 = &(this->terminalsT)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_150 = &(this->nonTerminalsV)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_110 = p_Var12;
    do {
      pvVar8 = Production::getToP_abi_cxx11_(*(Production **)(p_Var11 + 1));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_f0,pvVar8);
      uVar5 = local_f0._8_8_;
      uVar14 = local_f0._0_8_;
      getMarker_abi_cxx11_();
      _Var9 = std::
              __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                        (uVar14,uVar5,&local_140);
      if (local_140 != (pointer)(local_138 + 8)) {
        operator_delete(local_140,(ulong)((long)(_Rb_tree_color *)local_138._8_8_ + 1));
      }
      uVar15 = ((long)_Var9._M_current - local_f0._0_8_) * 0x8000000 + 0x100000000 >> 0x20;
      if (uVar15 < (ulong)((long)(local_f0._8_8_ - local_f0._0_8_) >> 5)) {
        local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
        pcVar2 = (((pointer)(local_f0._0_8_ + uVar15 * 0x20))->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_170,pcVar2,
                   pcVar2 + ((pointer)(local_f0._0_8_ + uVar15 * 0x20))->_M_string_length);
        _Var10._M_node =
             (local_100->terminalsT)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        local_140 = &local_170;
        if (_Var10._M_node != local_148) {
          do {
            bVar6 = __gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>::operator()
                              ((_Iter_equals_val<std::__cxx11::string_const> *)&local_140,_Var10);
            if (bVar6) break;
            _Var10._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var10._M_node);
          } while (_Var10._M_node != local_148);
        }
        if (_Var10._M_node == local_148) {
LAB_00121dca:
          p_Var12 = local_110;
          _Var10._M_node =
               (local_100->nonTerminalsV)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          local_140 = &local_170;
          if (_Var10._M_node != local_150) {
            do {
              bVar6 = __gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>::operator()
                                ((_Iter_equals_val<std::__cxx11::string_const> *)&local_140,_Var10);
              if (bVar6) break;
              _Var10._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var10._M_node);
            } while (_Var10._M_node != local_150);
          }
          if (_Var10._M_node != local_150) {
            initialProductionsFromVar
                      ((set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> *)
                       &local_140,&local_170,local_108);
            std::
            __set_union<std::_Rb_tree_const_iterator<Production*>,std::_Rb_tree_const_iterator<Production*>,std::insert_iterator<std::set<Production*,std::less<Production*>,std::allocator<Production*>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      (local_90._M_impl.super__Rb_tree_header._M_header._M_left,
                       &local_90._M_impl.super__Rb_tree_header,local_128,local_138,&local_90,
                       local_90._M_impl.super__Rb_tree_header._M_header._M_left);
            std::
            _Rb_tree<Production_*,_Production_*,_std::_Identity<Production_*>,_std::less<Production_*>,_std::allocator<Production_*>_>
            ::~_Rb_tree((_Rb_tree<Production_*,_Production_*,_std::_Identity<Production_*>,_std::less<Production_*>,_std::allocator<Production_*>_>
                         *)&local_140);
          }
        }
        else {
          if ((ulong)((long)(local_f0._8_8_ - local_f0._0_8_) >> 5) <= uVar15) {
            uVar14 = std::__throw_out_of_range_fmt
                               ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                ,uVar15);
            std::
            _Rb_tree<Production_*,_Production_*,_std::_Identity<Production_*>,_std::less<Production_*>,_std::allocator<Production_*>_>
            ::~_Rb_tree(&local_90);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~_Rb_tree(&local_60);
            _Unwind_Resume(uVar14);
          }
          local_140 = (pointer)(local_f0._0_8_ + uVar15 * 0x20);
          _Var10._M_node = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
          while (((_Rb_tree_header *)_Var10._M_node != p_Var1 &&
                 (bVar6 = __gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>::operator()
                                    ((_Iter_equals_val<std::__cxx11::string_const> *)&local_140,
                                     _Var10), !bVar6))) {
            _Var10._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var10._M_node);
          }
          if ((_Rb_tree_header *)_Var10._M_node != p_Var1) goto LAB_00121dca;
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&local_60,&local_170);
          p_Var12 = local_110;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p != &local_170.field_2) {
          operator_delete(local_170._M_dataplus._M_p,
                          CONCAT71(local_170.field_2._M_allocated_capacity._1_7_,
                                   local_170.field_2._M_local_buf[0]) + 1);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_f0);
      p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
    } while (p_Var11 != p_Var12);
  }
  std::
  __set_union<std::_Rb_tree_const_iterator<Production*>,std::_Rb_tree_const_iterator<Production*>,std::insert_iterator<std::set<Production*,std::less<Production*>,std::allocator<Production*>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (*(_Base_ptr *)(local_f8 + 0x18),p_Var12,
             local_90._M_impl.super__Rb_tree_header._M_header._M_left,
             &local_90._M_impl.super__Rb_tree_header,local_f8,*(_Base_ptr *)(local_f8 + 0x18));
  p_Var11 = (local_108->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_150 = &(local_108->_M_t)._M_impl.super__Rb_tree_header._M_header;
  if (p_Var11 == local_150) {
LAB_001221ce:
    sVar13 = (size_t)(int)local_98;
    sVar4 = *(size_t *)(local_f8 + 0x28);
    std::
    _Rb_tree<Production_*,_Production_*,_std::_Identity<Production_*>,_std::less<Production_*>,_std::allocator<Production_*>_>
    ::~_Rb_tree(&local_90);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_60);
    return sVar13 != sVar4;
  }
  do {
    local_d0 = *(Production **)(p_Var11 + 1);
    local_148 = p_Var11;
    pvVar8 = Production::getToP_abi_cxx11_(local_d0);
    pbVar16 = (pvVar8->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pbVar3 = (pvVar8->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    while( true ) {
      if (pbVar16 == pbVar3) goto LAB_001221b9;
      local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
      local_170._M_string_length = 0;
      local_170.field_2._M_local_buf[0] = '\0';
      local_140 = pbVar16;
      _Var10._M_node = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      while (((_Rb_tree_header *)_Var10._M_node != p_Var1 &&
             (bVar6 = __gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>::operator()
                                ((_Iter_equals_val<std::__cxx11::string_const> *)&local_140,_Var10),
             !bVar6))) {
        _Var10._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var10._M_node);
      }
      if ((_Rb_tree_header *)_Var10._M_node == p_Var1) goto LAB_0012219d;
      getMarker_abi_cxx11_();
      __n = pbVar16->_M_string_length;
      if (__n == local_138._0_8_) {
        if (__n == 0) {
          bVar6 = true;
        }
        else {
          iVar7 = bcmp((pbVar16->_M_dataplus)._M_p,local_140,__n);
          bVar6 = iVar7 == 0;
        }
      }
      else {
        bVar6 = false;
      }
      if (local_140 != (pointer)(local_138 + 8)) {
        operator_delete(local_140,(ulong)((long)(_Rb_tree_color *)local_138._8_8_ + 1));
      }
      if (bVar6) break;
      std::__cxx11::string::_M_append((char *)&local_170,(ulong)(pbVar16->_M_dataplus)._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2) {
        operator_delete(local_170._M_dataplus._M_p,
                        CONCAT71(local_170.field_2._M_allocated_capacity._1_7_,
                                 local_170.field_2._M_local_buf[0]) + 1);
      }
      pbVar16 = pbVar16 + 1;
    }
    pvVar8 = Production::getToP_abi_cxx11_(local_d0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_b0,pvVar8);
    pbVar3 = local_b0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar16 = local_b0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    getMarker_abi_cxx11_();
    _Var9 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                      (pbVar16,pbVar3,(_Iter_equals_val<std::__cxx11::string_const> *)&local_140);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase(&local_b0,(iterator)_Var9._M_current);
    if (local_140 != (pointer)(local_138 + 8)) {
      operator_delete(local_140,(ulong)((long)(_Rb_tree_color *)local_138._8_8_ + 1));
    }
    var = Production::getFromP_abi_cxx11_(local_d0);
    initialProductionsFromVar
              ((set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> *)
               &local_140,var,local_108);
    for (p_Var12 = local_128; p_Var12 != (_Rb_tree_node_base *)local_138;
        p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12)) {
      pvVar8 = Production::getToP_abi_cxx11_(*(Production **)(p_Var12 + 1));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_c8,pvVar8);
      pbVar3 = local_c8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pbVar16 = local_c8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      getMarker_abi_cxx11_();
      _Var9 = std::
              __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                        (pbVar16,pbVar3,local_f0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase(&local_c8,(iterator)_Var9._M_current);
      if ((pointer)local_f0._0_8_ != (pointer)(local_f0 + 0x10)) {
        operator_delete((void *)local_f0._0_8_,
                        (ulong)((long)&((_Alloc_hider *)local_f0._16_8_)->_M_p + 1));
      }
      if (((long)local_b0.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_b0.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start ==
           (long)local_c8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_c8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start) &&
         (bVar6 = std::__equal<false>::
                  equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                            (local_b0.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                             local_b0.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish,
                             local_c8.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start), bVar6)) {
        std::
        _Rb_tree<Production*,Production*,std::_Identity<Production*>,std::less<Production*>,std::allocator<Production*>>
        ::_M_insert_unique<Production*const&>(local_f8,&local_d0);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_c8);
    }
    std::
    _Rb_tree<Production_*,_Production_*,_std::_Identity<Production_*>,_std::less<Production_*>,_std::allocator<Production_*>_>
    ::~_Rb_tree((_Rb_tree<Production_*,_Production_*,_std::_Identity<Production_*>,_std::less<Production_*>,_std::allocator<Production_*>_>
                 *)&local_140);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_b0);
LAB_0012219d:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p,
                      CONCAT71(local_170.field_2._M_allocated_capacity._1_7_,
                               local_170.field_2._M_local_buf[0]) + 1);
    }
LAB_001221b9:
    p_Var11 = (_Base_ptr)std::_Rb_tree_increment(local_148);
    if (p_Var11 == local_150) goto LAB_001221ce;
  } while( true );
}

Assistant:

bool GLRParser::closure(std::set<Production *> &markedProductions, std::set<Production *> &allMarkedProductions) {
    std::set<std::string> terminalsImmRightOfMarker;
    std::set<Production *> followingTerminalInit;
    int originalMarkedProductionsSize = markedProductions.size();
    for (auto production: markedProductions) {
        std::vector<std::string> prodTo = production->getToP();
        auto it = std::find(prodTo.begin(), prodTo.end(), getMarker());
        // find the index
        int index = std::distance(prodTo.begin(), it);

        // Find the character to the immidiate right
        if (index + 1 < prodTo.size()) {
            // Check whether it's a terminal and whether it isn't included yet in the list
            std::string nextChar = prodTo.at(index + 1);
            if (std::find(terminalsT.begin(), terminalsT.end(), nextChar) != terminalsT.end() &&
                std::find(terminalsImmRightOfMarker.begin(), terminalsImmRightOfMarker.end(), prodTo.at(index + 1)) ==
                terminalsImmRightOfMarker.end()) {
                terminalsImmRightOfMarker.insert(nextChar);
//                changed = true;
            } else if (std::find(nonTerminalsV.begin(), nonTerminalsV.end(), nextChar) != nonTerminalsV.end()) {
                std::set<Production *> initProductionsFromVar = initialProductionsFromVar(nextChar,
                                                                                          allMarkedProductions);
//                for(auto prod: initProductionsFromVar){
//                    followingTerminalInit.insert(prod);
//                }
                set_union(followingTerminalInit.begin(), followingTerminalInit.end(), initProductionsFromVar.begin(),
                          initProductionsFromVar.end(),
                          std::inserter(followingTerminalInit, followingTerminalInit.begin()));
            }
        }
    }

    set_union(markedProductions.begin(), markedProductions.end(), followingTerminalInit.begin(),
              followingTerminalInit.end(), std::inserter(markedProductions, markedProductions.begin()));

    // "Then, we add to the set the initial forms of all rewrite rules in the grammar whose left-hand sides consist of
    // those nonterminals as well." -> What do they mean with consists of? Contains all of them? Only contains those? ...
    for (auto production: allMarkedProductions) {
        for (const auto &c: production->getToP()) {
            std::string str;
            if (std::find(terminalsImmRightOfMarker.begin(), terminalsImmRightOfMarker.end(), c) ==
                terminalsImmRightOfMarker.end()) {
                // The char is not in the list with specified terminals
                break;
            }
            if (c == getMarker()) {
                // this must only be the production of the form of the current production, not all first productions
                auto prodTo1 = production->getToP();
                prodTo1.erase(std::find(prodTo1.begin(), prodTo1.end(), getMarker()));
                std::set<Production *> init = initialProductionsFromVar(production->getFromP(), allMarkedProductions);
                for (auto prod: init) {
                    auto prodTo2 = prod->getToP();
                    prodTo2.erase(std::find(prodTo2.begin(), prodTo2.end(), getMarker()));
                    if (prodTo1 == prodTo2) { // TODO: check if still working (changed from if true)
                        markedProductions.insert(production);
//                        changed = true;
                    }
                }
                break;
            }
            str += c;
        }
    }

    // return whether anything has been changed

    return originalMarkedProductionsSize != markedProductions.size();
}